

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O2

void __thiscall FileManager::closeFile(FileManager *this)

{
  element_type *peVar1;
  __shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  peVar1 = (this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_AssemblerFile[3])();
    local_18._M_ptr = (element_type *)0x0;
    local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->activeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>,
               &local_18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
    return;
  }
  Logger::queueError<>(Warning,"No file opened");
  return;
}

Assistant:

void FileManager::closeFile()
{
	if (activeFile == nullptr)
	{
		Logger::queueError(Logger::Warning, "No file opened");
		return;
	}

	activeFile->close();
	activeFile = nullptr;
}